

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_base.h
# Opt level: O0

void __thiscall
draco::EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::Reset
          (EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *this,
          EncoderOptionsBase<draco::GeometryAttribute::Type> *options)

{
  EncoderOptionsBase<draco::GeometryAttribute::Type> *in_RSI;
  EncoderOptionsBase<draco::GeometryAttribute::Type> *in_stack_ffffffffffffffe8;
  
  EncoderOptionsBase<draco::GeometryAttribute::Type>::operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void Reset(const EncoderOptionsT &options) { options_ = options; }